

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  AddressFormatData *__return_storage_ptr__;
  pointer puVar1;
  NetType_conflict NVar2;
  string local_a8;
  Script *local_80;
  TaprootScriptTree *local_78;
  SchnorrPubkey *local_70;
  Pubkey *local_68;
  ByteData *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string *local_50;
  CfdSourceLocation local_48;
  
  this->type_ = type;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  local_58 = &(this->address_).field_2;
  (this->address_)._M_dataplus._M_p = (pointer)local_58;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  local_60 = &this->hash_;
  local_50 = &this->address_;
  ByteData::ByteData(local_60);
  local_68 = &this->pubkey_;
  Pubkey::Pubkey(local_68);
  local_70 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(local_70);
  local_78 = &this->script_tree_;
  TaprootScriptTree::TaprootScriptTree(local_78,tree);
  local_80 = &this->redeem_script_;
  Script::Script(local_80);
  __return_storage_ptr__ = &this->format_data_;
  GetTargetFormatData(__return_storage_ptr__,network_parameters,type);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  NVar2 = AddressFormatData::GetNetType(__return_storage_ptr__);
  this->type_ = NVar2;
  TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&local_a8,&tree->super_TapBranch,internal_pubkey,(bool *)0x0);
  puVar1 = (this->schnorr_pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_a8._M_dataplus._M_p;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_a8._M_string_length;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_a8.field_2._M_allocated_capacity;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    if (local_a8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_a8,__return_storage_ptr__);
  CalculateTaproot(this,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x29a;
  local_48.funcname = "Address";
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_a8,__return_storage_ptr__);
  logger::log<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string&>
            (&local_48,kCfdLogLevelInfo,"call Address({},{},{})",&this->type_,&this->addr_type_,
             &local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey,
    const std::vector<AddressFormatData>& network_parameters)
    : type_(type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      script_tree_(tree),
      redeem_script_(),
      format_data_(GetTargetFormatData(network_parameters, type)) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  schnorr_pubkey_ = tree.GetTweakedPubkey(internal_pubkey);
  CalculateTaproot(format_data_.GetBech32Hrp());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_,
      format_data_.GetBech32Hrp());
}